

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>>::
emplace_back<slang::SmallVector<slang::ast::NetAlias,2ul>>
          (SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *this,
          SmallVector<slang::ast::NetAlias,_2UL> *args)

{
  SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *in_RDI;
  SmallVector<slang::ast::NetAlias,_2UL> *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *in_stack_00000030;
  SmallVector<slang::ast::NetAlias,_2UL> *in_stack_ffffffffffffffd8;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::end(in_RDI);
    local_8 = emplaceRealloc<slang::SmallVector<slang::ast::NetAlias,2ul>>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::end(in_RDI);
    SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
              ((SmallVector<slang::ast::NetAlias,_2UL> *)in_RDI,in_stack_ffffffffffffffd8);
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }